

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

int tinyusdz::USDZReadAsset
              (char *resolved_asset_name,uint64_t req_bytes,uint8_t *out_buf,uint64_t *nbytes,
              string *err,void *userdata)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this;
  uint64_t *__dest;
  uint64_t uVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uchar *puVar6;
  allocator local_1e1;
  string local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator local_179;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  uint8_t *local_118;
  size_t sz;
  string local_108 [32];
  unsigned_long local_e8;
  pair<unsigned_long,_unsigned_long> byte_range;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_69;
  string local_68 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_48;
  USDZAsset *passet;
  void *userdata_local;
  string *err_local;
  uint64_t *nbytes_local;
  uint8_t *out_buf_local;
  uint64_t req_bytes_local;
  char *resolved_asset_name_local;
  
  passet = (USDZAsset *)userdata;
  userdata_local = err;
  err_local = (string *)nbytes;
  nbytes_local = (uint64_t *)out_buf;
  out_buf_local = (uint8_t *)req_bytes;
  req_bytes_local = (uint64_t)resolved_asset_name;
  if (userdata == (void *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`userdata` must be non-null.\n");
    }
    resolved_asset_name_local._4_4_ = -1;
  }
  else if (resolved_asset_name == (char *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`resolved_asset_name` must be non-null.\n");
    }
    resolved_asset_name_local._4_4_ = -2;
  }
  else if (out_buf == (uint8_t *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`out_buf` must be non-null.\n");
    }
    resolved_asset_name_local._4_4_ = -2;
  }
  else if (nbytes == (uint64_t *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`nbytes` must be non-null.\n");
    }
    resolved_asset_name_local._4_4_ = -2;
  }
  else {
    local_48 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)userdata;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,resolved_asset_name,&local_69);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)userdata,(key_type *)local_68);
    ::std::__cxx11::string::~string(local_68);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    uVar1 = req_bytes_local;
    this = local_48;
    if (sVar2 == 0) {
      if (userdata_local != (void *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d0,(char *)uVar1,(allocator *)((long)&byte_range.second + 7));
        ::std::operator+((char *)&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "resolved_asset_name `");
        ::std::operator+(&local_90,&local_b0,"` not found in USDZAsset.\n");
        ::std::__cxx11::string::operator+=((string *)userdata_local,(string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string(local_d0);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&byte_range.second + 7));
      }
      resolved_asset_name_local._4_4_ = -1;
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_108,(char *)uVar1,(allocator *)((long)&sz + 7));
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::at(this,(key_type *)local_108);
      local_e8 = pmVar3->first;
      byte_range.first = pmVar3->second;
      ::std::__cxx11::string::~string(local_108);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&sz + 7));
      uVar1 = req_bytes_local;
      if (local_e8 < byte_range.first) {
        local_118 = (uint8_t *)(byte_range.first - local_e8);
        if (out_buf_local < local_118) {
          if (userdata_local != (void *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_178,(char *)uVar1,&local_179);
            ::std::operator+((char *)&local_158,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "USDZAsset ");
            ::std::operator+(&local_138,&local_158,"\'s size exceeds requested bytes.\n");
            ::std::__cxx11::string::operator+=((string *)userdata_local,(string *)&local_138);
            ::std::__cxx11::string::~string((string *)&local_138);
            ::std::__cxx11::string::~string((string *)&local_158);
            ::std::__cxx11::string::~string(local_178);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_179);
          }
          resolved_asset_name_local._4_4_ = -2;
        }
        else {
          puVar4 = local_118 + local_e8;
          puVar5 = (uint8_t *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (local_48 + 0x30));
          uVar1 = req_bytes_local;
          __dest = nbytes_local;
          if (puVar5 < puVar4) {
            if (userdata_local != (void *)0x0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_1e0,(char *)uVar1,&local_1e1);
              ::std::operator+((char *)&local_1c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Invalid USDZAsset size: ");
              ::std::operator+(&local_1a0,&local_1c0,"\n");
              ::std::__cxx11::string::operator+=((string *)userdata_local,(string *)&local_1a0);
              ::std::__cxx11::string::~string((string *)&local_1a0);
              ::std::__cxx11::string::~string((string *)&local_1c0);
              ::std::__cxx11::string::~string(local_1e0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            }
            resolved_asset_name_local._4_4_ = -2;
          }
          else {
            puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (local_48 + 0x30));
            memcpy(__dest,puVar6 + local_e8,(size_t)local_118);
            *(uint8_t **)err_local = local_118;
            resolved_asset_name_local._4_4_ = 0;
          }
        }
      }
      else {
        if (userdata_local != (void *)0x0) {
          ::std::__cxx11::string::operator+=
                    ((string *)userdata_local,"Invalid USDZAsset byte range.\n");
        }
        resolved_asset_name_local._4_4_ = -2;
      }
    }
  }
  return resolved_asset_name_local._4_4_;
}

Assistant:

int USDZReadAsset(const char *resolved_asset_name, uint64_t req_bytes, uint8_t *out_buf, uint64_t *nbytes, std::string *err, void *userdata) {
  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -1;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!out_buf) {
    if (err) {
      (*err) += "`out_buf` must be non-null.\n";
    }
    return -2;
  }

  if (!nbytes) {
    if (err) {
      (*err) += "`nbytes` must be non-null.\n";
    }
    return -2;
  }

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (!passet->asset_map.count(resolved_asset_name)) {
    if (err) {
      (*err) += "resolved_asset_name `" + std::string(resolved_asset_name) + "` not found in USDZAsset.\n";
    }
    return -1;
  }

  std::pair<size_t, size_t> byte_range = passet->asset_map.at(resolved_asset_name);

  if (byte_range.first >= byte_range.second) {
    if (err) {
      (*err) += "Invalid USDZAsset byte range.\n";
    }
    return -2;
  }

  size_t sz = byte_range.second - byte_range.first;

  if (sz > req_bytes) {
    if (err) {
      (*err) += "USDZAsset " + std::string(resolved_asset_name) + "'s size exceeds requested bytes.\n";
    }
    return -2;
  }

  if (byte_range.first + sz > passet->data.size()) {
    if (err) {
      (*err) += "Invalid USDZAsset size: " + std::string(resolved_asset_name) + "\n";
    }
    return -2;
  }

  memcpy(out_buf, passet->data.data() + byte_range.first, sz);
  (*nbytes) = sz;

  return 0;
}